

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestProgress::testStuff(TestProgress *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QColor *pQVar4;
  ProgressBar p;
  QColor local_50;
  ProgressBar local_40;
  
  QtMWidgets::ProgressBar::ProgressBar(&local_40,(QWidget *)0x0);
  QColor::QColor(&local_50,red);
  QtMWidgets::ProgressBar::setGrooveColor(&local_40,&local_50);
  QtMWidgets::ProgressBar::setGrooveHeight(&local_40,10);
  QColor::QColor(&local_50,green);
  QtMWidgets::ProgressBar::setHighlightColor(&local_40,&local_50);
  pQVar4 = QtMWidgets::ProgressBar::grooveColor(&local_40);
  QColor::QColor(&local_50,red);
  bVar1 = (bool)QColor::operator==(pQVar4,&local_50);
  cVar2 = QTest::qVerify(bVar1,"p.grooveColor() == Qt::red","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                         ,0x84);
  if (cVar2 != '\0') {
    iVar3 = QtMWidgets::ProgressBar::grooveHeight(&local_40);
    cVar2 = QTest::qVerify(iVar3 == 10,"p.grooveHeight() == 10","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                           ,0x85);
    if (cVar2 != '\0') {
      pQVar4 = QtMWidgets::ProgressBar::highlightColor(&local_40);
      QColor::QColor(&local_50,green);
      bVar1 = (bool)QColor::operator==(pQVar4,&local_50);
      QTest::qVerify(bVar1,"p.highlightColor() == Qt::green","",
                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                     ,0x86);
    }
  }
  QtMWidgets::ProgressBar::~ProgressBar(&local_40);
  return;
}

Assistant:

void testStuff()
	{
		QtMWidgets::ProgressBar p;

		p.setGrooveColor( Qt::red );
		p.setGrooveHeight( 10 );
		p.setHighlightColor( Qt::green );

		QVERIFY( p.grooveColor() == Qt::red );
		QVERIFY( p.grooveHeight() == 10 );
		QVERIFY( p.highlightColor() == Qt::green );
	}